

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O1

SUNErrCode SUNAdaptController_UpdateH(SUNAdaptController C,sunrealtype h,sunrealtype dsm)

{
  _func_SUNErrCode_SUNAdaptController_sunrealtype_sunrealtype *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  if (C == (SUNAdaptController)0x0) {
    return -9999;
  }
  UNRECOVERED_JUMPTABLE = C->ops->updateh;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNAdaptController_sunrealtype_sunrealtype *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(C,h,dsm);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_UpdateH(SUNAdaptController C, sunrealtype h,
                                      sunrealtype dsm)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(isfinite(h), SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(dsm >= SUN_RCONST(0.0), SUN_ERR_ARG_OUTOFRANGE);
  if (C->ops->updateh) { ier = C->ops->updateh(C, h, dsm); }
  return (ier);
}